

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O3

void __thiscall
Imf_2_5::TiledRgbaInputFile::FromYa::setFrameBuffer
          (FromYa *this,Rgba *base,size_t xStride,size_t yStride,string *channelNamePrefix)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined1 in_R10B;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  FrameBuffer fb;
  Slice local_68;
  
  if (this->_fbBase == (Rgba *)0x0) {
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    paVar1 = &__str.field_2;
    pcVar2 = (channelNamePrefix->_M_dataplus)._M_p;
    __str._M_dataplus._M_p = (pointer)paVar1;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__str,pcVar2,pcVar2 + channelNamePrefix->_M_string_length);
    std::__cxx11::string::append((char *)&__str);
    Slice::Slice(&local_68,HALF,(char *)&((this->_buf)._data)->g,8,(ulong)this->_tileXSize << 3,1,1,
                 0.0,(bool)in_R10B,true);
    FrameBuffer::insert(&fb,&__str,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != paVar1) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = (channelNamePrefix->_M_dataplus)._M_p;
    __str._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__str,pcVar2,pcVar2 + channelNamePrefix->_M_string_length);
    std::__cxx11::string::append((char *)&__str);
    Slice::Slice(&local_68,HALF,(char *)&((this->_buf)._data)->a,8,(ulong)this->_tileXSize << 3,1,1,
                 1.0,(bool)in_R10B,true);
    FrameBuffer::insert(&fb,&__str,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != paVar1) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    TiledInputFile::setFrameBuffer(this->_inputFile,&fb);
    std::
    _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                 *)&fb);
  }
  this->_fbBase = base;
  this->_fbXStride = xStride;
  this->_fbYStride = yStride;
  return;
}

Assistant:

void
TiledRgbaInputFile::FromYa::setFrameBuffer (Rgba *base,
					    size_t xStride,
					    size_t yStride,
					    const string &channelNamePrefix)
{
    if (_fbBase == 0)
{
	FrameBuffer fb;

	fb.insert (channelNamePrefix + "Y",
		   Slice (HALF,				// type
			  (char *) &_buf[0][0].g,	// base
			  sizeof (Rgba),		// xStride
			  sizeof (Rgba) * _tileXSize,	// yStride
			  1, 1,				// sampling
			  0.0,				// fillValue
			  true, true));			// tileCoordinates

	fb.insert (channelNamePrefix + "A",
		   Slice (HALF,				// type
			  (char *) &_buf[0][0].a,	// base
			  sizeof (Rgba),		// xStride
			  sizeof (Rgba) * _tileXSize,	// yStride
			  1, 1,				// sampling
			  1.0,				// fillValue
			  true, true));			// tileCoordinates

	_inputFile.setFrameBuffer (fb);
    }

    _fbBase = base;
    _fbXStride = xStride;
    _fbYStride = yStride;
}